

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void RightAlignedText(char *t,int w)

{
  undefined8 in_RDI;
  ImVec2 s;
  char *in_stack_00000018;
  
  ImGui::CalcTextSize(in_stack_00000018,t,w._3_1_,s.y);
  ImGui::Dummy((ImVec2 *)t);
  ImGui::SameLine(0.0,-1.0);
  ImGui::Text("%s",in_RDI);
  return;
}

Assistant:

void RightAlignedText(const char *t, int w) {
	ImVec2 s = ImGui::CalcTextSize(t);
	s.x      = w - s.x;
	ImGui::Dummy(s);
	ImGui::SameLine();
	ImGui::Text("%s", t);
}